

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpatch_tests.cpp
# Opt level: O2

void check_patch<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *target,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *patch,
               error_code *expected_ec,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *expected)

{
  type_conflict9 tVar1;
  ostream *os;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  SourceLineInfo local_e8;
  BinaryExpr<const_std::error_code_&,_const_std::error_code_&> local_d8;
  AssertionHandler catchAssertionHandler;
  error_code ec;
  StringRef local_50;
  StringRef local_40;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  jsoncons::jsonpatch::
  apply_patch<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (target,patch,&ec);
  if ((ec._M_cat == expected_ec->_M_cat) && (ec._M_value == expected_ec->_M_value)) {
    tVar1 = jsoncons::operator!=(expected,target);
    if (!tVar1) goto LAB_002f018f;
  }
  os = std::operator<<((ostream *)&std::cout,"target:\n");
  pbVar2 = jsoncons::operator<<((basic_ostream<char,_std::char_traits<char>_> *)os,target);
  std::operator<<((ostream *)pbVar2,'\n');
LAB_002f018f:
  local_d8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_d8.super_ITransientExpression.m_isBinaryExpression = true;
  local_d8.super_ITransientExpression.m_result = false;
  local_d8.super_ITransientExpression._10_6_ = 0;
  local_e8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpatch/src/jsonpatch_tests.cpp"
  ;
  local_e8.line = 0x1d;
  Catch::StringRef::StringRef(&local_40,"ec == expected_ec");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_d8,&local_e8,local_40,ContinueOnFailure);
  local_e8.file = (char *)&ec;
  Catch::ExprLhs<std::error_code_const&>::operator==
            (&local_d8,(ExprLhs<std::error_code_const&> *)&local_e8,expected_ec);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_d8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x6522ad;
  local_d8.super_ITransientExpression.m_isBinaryExpression = true;
  local_d8.super_ITransientExpression.m_result = false;
  local_d8.super_ITransientExpression._10_6_ = 0;
  local_e8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpatch/src/jsonpatch_tests.cpp"
  ;
  local_e8.line = 0x1e;
  Catch::StringRef::StringRef(&local_50,"expected == target");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_d8,&local_e8,local_50,ContinueOnFailure);
  local_e8.file = (char *)expected;
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)&local_d8,
             (ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
              *)&local_e8,target);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_d8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void check_patch(Json& target, const Json& patch, const std::error_code& expected_ec, const Json& expected)
{
    std::error_code ec;
    jsonpatch::apply_patch(target, patch, ec);
    if (ec != expected_ec || expected != target)
    {
        std::cout << "target:\n" << target << '\n';
    }
    CHECK(ec == expected_ec); //-V521
    CHECK(expected == target); //-V521
}